

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O1

backtracer * __thiscall spdlog::details::backtracer::operator=(backtracer *this,backtracer *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_type sVar3;
  size_t sVar4;
  int iVar5;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar5 == 0) {
    LOCK();
    (this->enabled_)._M_base._M_i = (__int_type_conflict1)((other->enabled_)._M_base._M_i & 1);
    UNLOCK();
    sVar3 = (other->messages_).head_;
    (this->messages_).max_items_ = (other->messages_).max_items_;
    (this->messages_).head_ = sVar3;
    uVar1 = *(undefined4 *)((long)&(other->messages_).tail_ + 4);
    sVar4 = (other->messages_).overrun_counter_;
    uVar2 = *(undefined4 *)((long)&(other->messages_).overrun_counter_ + 4);
    *(int *)&(this->messages_).tail_ = (int)(other->messages_).tail_;
    *(undefined4 *)((long)&(this->messages_).tail_ + 4) = uVar1;
    *(int *)&(this->messages_).overrun_counter_ = (int)sVar4;
    *(undefined4 *)((long)&(this->messages_).overrun_counter_ + 4) = uVar2;
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    _M_move_assign(&(this->messages_).v_,&(other->messages_).v_);
    (other->messages_).tail_ = 0;
    (other->messages_).overrun_counter_ = 0;
    (other->messages_).max_items_ = 0;
    (other->messages_).head_ = 0;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return this;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

SPDLOG_INLINE backtracer &backtracer::operator=(backtracer other)
{
    std::lock_guard<std::mutex> lock(mutex_);
    enabled_ = other.enabled();
    messages_ = std::move(other.messages_);
    return *this;
}